

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MCRegisterInfo.c
# Opt level: O0

uint MCRegisterInfo_getMatchingSuperReg(MCRegisterInfo *RI,uint Reg,uint SubIdx,MCRegisterClass *RC)

{
  _Bool _Var1;
  uint16_t uVar2;
  uint uVar3;
  undefined1 local_38 [6];
  uint16_t val;
  DiffListIterator iter;
  MCRegisterClass *RC_local;
  uint SubIdx_local;
  uint Reg_local;
  MCRegisterInfo *RI_local;
  
  if (Reg < RI->NumRegs) {
    iter.List = (MCPhysReg *)RC;
    DiffListIterator_init
              ((DiffListIterator *)local_38,(MCPhysReg)Reg,RI->DiffLists + RI->Desc[Reg].SuperRegs);
    DiffListIterator_next((DiffListIterator *)local_38);
    while (_Var1 = DiffListIterator_isValid((DiffListIterator *)local_38), _Var1) {
      uVar2 = DiffListIterator_getVal((DiffListIterator *)local_38);
      _Var1 = MCRegisterClass_contains((MCRegisterClass *)iter.List,(uint)uVar2);
      if ((_Var1) && (uVar3 = MCRegisterInfo_getSubReg(RI,(uint)uVar2,SubIdx), Reg == uVar3)) {
        return (uint)uVar2;
      }
      DiffListIterator_next((DiffListIterator *)local_38);
    }
  }
  return 0;
}

Assistant:

unsigned MCRegisterInfo_getMatchingSuperReg(MCRegisterInfo *RI, unsigned Reg, unsigned SubIdx, MCRegisterClass *RC)
{
	DiffListIterator iter;

	if (Reg >= RI->NumRegs) {
		return 0;
	}

	DiffListIterator_init(&iter, (MCPhysReg)Reg, RI->DiffLists + RI->Desc[Reg].SuperRegs);
	DiffListIterator_next(&iter);

	while(DiffListIterator_isValid(&iter)) {
		uint16_t val = DiffListIterator_getVal(&iter);
		if (MCRegisterClass_contains(RC, val) && Reg ==  MCRegisterInfo_getSubReg(RI, val, SubIdx))
			return val;

		DiffListIterator_next(&iter);
	}

	return 0;
}